

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath * __thiscall
testing::internal::FilePath::RemoveExtension
          (FilePath *__return_storage_ptr__,FilePath *this,char *extension)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  undefined1 local_48 [8];
  string dot_extension;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,".",(allocator<char> *)(dot_extension.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_88,extension);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = String::EndsWithCaseInsensitive(&this->pathname_,(string *)local_48);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)this);
    FilePath(__return_storage_ptr__,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(
        pathname_.substr(0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}